

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QWidget *parent)

{
  DateTimePickerPrivate *pDVar1;
  ConnectionType type;
  undefined1 local_88 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_78;
  code *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  QStack_50;
  code *local_48;
  undefined8 local_40;
  undefined1 local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  DateTimePicker *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00237708;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_002378b8;
  pDVar1 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(pDVar1,this,QDateTime);
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  ::QScopedPointer(&this->d,pDVar1);
  QSizePolicy::QSizePolicy((QSizePolicy *)(local_38 + 8),Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_48 = Scroller::aboutToStart;
  local_40 = 0;
  local_60._8_8_ = _q_scrollAboutToStart;
  QStack_50.d = (ScrollerPrivate *)0x0;
  type = (ConnectionType)this;
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_38,(offset_in_Scroller_to_subr)pDVar1->scroller,
             (Object *)Scroller::aboutToStart,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  local_70 = Scroller::scroll;
  local_68 = 0;
  local_88._8_8_ = _q_scroll;
  QStack_78.d = (ScrollerPrivate *)0x0;
  QObject::
  connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::DateTimePicker::*)(int,int)>
            ((Object *)local_60,(offset_in_Scroller_to_subr)pDVar1->scroller,
             (Object *)Scroller::scroll,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pDVar1 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::Scroller::*)(),void(QtMWidgets::DateTimePicker::*)()>
            ((Object *)local_88,(offset_in_Scroller_to_subr)pDVar1->scroller,
             (Object *)Scroller::finished,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}